

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

bool __thiscall CConnman::CheckIncomingNonce(CConnman *this,uint64_t nonce)

{
  CNode *pCVar1;
  pointer ppCVar2;
  bool bVar3;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock25;
  unique_lock<std::recursive_mutex> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._M_device = &(this->m_nodes_mutex).super_recursive_mutex;
  local_28._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_28);
  ppCVar2 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  bVar3 = true;
  do {
    if (ppCVar2 ==
        (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
LAB_0019d404:
      std::unique_lock<std::recursive_mutex>::~unique_lock(&local_28);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        return bVar3;
      }
      __stack_chk_fail();
    }
    pCVar1 = *ppCVar2;
    if (((((pCVar1->fSuccessfullyConnected)._M_base._M_i & 1U) == 0) &&
        (pCVar1->m_conn_type != INBOUND)) && (pCVar1->nLocalHostNonce == nonce)) {
      bVar3 = false;
      goto LAB_0019d404;
    }
    ppCVar2 = ppCVar2 + 1;
  } while( true );
}

Assistant:

bool CConnman::CheckIncomingNonce(uint64_t nonce)
{
    LOCK(m_nodes_mutex);
    for (const CNode* pnode : m_nodes) {
        if (!pnode->fSuccessfullyConnected && !pnode->IsInboundConn() && pnode->GetLocalNonce() == nonce)
            return false;
    }
    return true;
}